

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O2

void __thiscall libtorrent::dht::find_data::start(find_data *this)

{
  pointer pnVar1;
  vector<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_> nodes;
  endpoint local_44;
  
  if ((this->super_traversal_algorithm).m_results.
      super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->super_traversal_algorithm).m_results.
      super__Vector_base<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    routing_table::find_node
              (&nodes,&((this->super_traversal_algorithm).m_node)->m_table,
               &(this->super_traversal_algorithm).m_target,(find_nodes_flags_t)0x1,0);
    for (pnVar1 = nodes.
                  super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar1 != nodes.
                  super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pnVar1 = pnVar1 + 1) {
      aux::union_endpoint::operator_cast_to_basic_endpoint(&local_44,&pnVar1->endpoint);
      traversal_algorithm::add_entry
                (&this->super_traversal_algorithm,&pnVar1->id,&local_44,(observer_flags_t)0x2);
    }
    ::std::_Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>::
    ~_Vector_base(&nodes.
                   super__Vector_base<libtorrent::dht::node_entry,_std::allocator<libtorrent::dht::node_entry>_>
                 );
  }
  traversal_algorithm::start(&this->super_traversal_algorithm);
  return;
}

Assistant:

void find_data::start()
{
	// if the user didn't add seed-nodes manually, grab k (bucket size)
	// nodes from routing table.
	if (m_results.empty())
	{
		std::vector<node_entry> const nodes = m_node.m_table.find_node(
			target(), routing_table::include_failed);

		for (auto const& n : nodes)
		{
			add_entry(n.id, n.ep(), observer::flag_initial);
		}
	}

	traversal_algorithm::start();
}